

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O2

char * __thiscall NaVector::get_string(NaVector *this,char *szBuf,char *szDelim)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  uint uVar4;
  int __c;
  double dVar5;
  char *szNext;
  char *local_38;
  
  while( true ) {
    cVar1 = *szBuf;
    iVar2 = isspace((int)cVar1);
    if (((cVar1 == '\0') || (iVar2 == 0)) ||
       (pcVar3 = strchr(szDelim,(int)cVar1), pcVar3 == (char *)0x0)) break;
    szBuf = szBuf + 1;
  }
  (*this->_vptr_NaVector[4])(this,0);
  uVar4 = 0;
  do {
    while( true ) {
      cVar1 = *szBuf;
      __c = (int)cVar1;
      iVar2 = isspace(__c);
      if ((cVar1 != '\0') && (iVar2 != 0)) break;
      if (cVar1 == '\0') {
        return szBuf;
      }
LAB_00154113:
      pcVar3 = strchr(szDelim,__c);
      if (pcVar3 != (char *)0x0) {
        return szBuf;
      }
      dVar5 = strtod(szBuf,&local_38);
      pcVar3 = local_38;
      if (szBuf == local_38) {
        return szBuf;
      }
      (*this->_vptr_NaVector[4])(this,(ulong)(uVar4 + 1));
      iVar2 = (*this->_vptr_NaVector[7])(this,(ulong)uVar4);
      *(double *)CONCAT44(extraout_var,iVar2) = dVar5;
      szBuf = pcVar3;
      uVar4 = uVar4 + 1;
    }
    pcVar3 = strchr(szDelim,__c);
    if (pcVar3 == (char *)0x0) goto LAB_00154113;
    szBuf = szBuf + 1;
  } while( true );
}

Assistant:

const char*
NaVector::get_string (const char* szBuf, const char* szDelim)
{
    const char  *szPtr = szBuf;
    char        *szNext;
    unsigned    i;

    // skip leading spaces
    while(isspace(*szPtr) && *szPtr != '\0' &&
          NULL != strchr(szDelim, *szPtr))
        ++szPtr;

    new_dim(0);

    for(i = 0; ; ++i){
        //??? Strange things: szPtr value differs from (4) to (1) 
        //???NaPrintLog("get_string(1): szPtr='%s'(%p)\n", szPtr, szPtr);

        // skip leading spaces
        while(isspace(*szPtr) && *szPtr != '\0' &&
              NULL != strchr(szDelim, *szPtr))
            ++szPtr;

        //???NaPrintLog("get_string(2): szPtr='%s'(%p)\n", szPtr, szPtr);

        // while current string is not a delimiter and is not EOS...
        if('\0' == *szPtr || NULL != strchr(szDelim, *szPtr))
            break;

        // read number
        NaReal  fVal = strtod(szPtr, &szNext);
        //???NaPrintLog("get_string(): '%s' -> %g, next is '%s'\n",
        //???           szPtr, fVal, szNext);

        if(szNext == szPtr){
            // error while reading
            return szPtr;
        }
        szPtr = szNext;
        //???NaPrintLog("get_string(3): szPtr='%s'(%p)\n", szPtr, szPtr);

        new_dim(i + 1);
        fetch(i) = fVal;

        //???NaPrintLog("get_string(4): szPtr='%s'(%p)\n", szPtr, szPtr);
    }

    return szPtr;
}